

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

StringRef __thiscall llvm::DataExtractor::getCStrRef(DataExtractor *this,uint64_t *offset_ptr)

{
  size_t From;
  size_t sVar1;
  char *pcVar2;
  size_type Pos;
  uint64_t Start;
  uint64_t *offset_ptr_local;
  DataExtractor *this_local;
  
  From = *offset_ptr;
  sVar1 = StringRef::find(&this->Data,'\0',From);
  if (sVar1 == 0xffffffffffffffff) {
    memset(&this_local,0,0x10);
    StringRef::StringRef((StringRef *)&this_local);
  }
  else {
    *offset_ptr = sVar1 + 1;
    pcVar2 = StringRef::data(&this->Data);
    StringRef::StringRef((StringRef *)&this_local,pcVar2 + From,sVar1 - From);
  }
  return _this_local;
}

Assistant:

StringRef DataExtractor::getCStrRef(uint64_t *offset_ptr) const {
  uint64_t Start = *offset_ptr;
  StringRef::size_type Pos = Data.find('\0', Start);
  if (Pos != StringRef::npos) {
    *offset_ptr = Pos + 1;
    return StringRef(Data.data() + Start, Pos - Start);
  }
  return StringRef();
}